

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint8_t *puVar1;
  uint uVar2;
  
  while( true ) {
    if (this->had_error_ == true) {
      return this->buffer_;
    }
    uVar2 = (int)ptr - (int)this->end_;
    if ((int)uVar2 < 0) break;
    if (0x10 < (int)uVar2) goto LAB_00231b30;
    puVar1 = Next(this);
    ptr = puVar1 + (uVar2 & 0x7fffffff);
    if (ptr < this->end_) {
      return ptr;
    }
  }
  EnsureSpaceFallback((EpsCopyOutputStream *)&stack0xffffffffffffffe0);
LAB_00231b30:
  EnsureSpaceFallback((EpsCopyOutputStream *)&stack0xffffffffffffffe0);
}

Assistant:

uint8_t* EpsCopyOutputStream::EnsureSpaceFallback(uint8_t* ptr) {
  do {
    if (ABSL_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    ABSL_DCHECK(overrun >= 0);           // NOLINT
    ABSL_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  ABSL_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}